

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_utils.hpp
# Opt level: O2

optional<unsigned_long> __thiscall
graph_utils::
Dsu<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_graph::HashTableBased>
::Size(Dsu<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_graph::HashTableBased>
       *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u)

{
  iterator iVar1;
  _Storage<unsigned_long,_true> unaff_R15;
  optional<unsigned_long> oVar2;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> u_rep;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  
  Find((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
       )&local_40,this,u);
  if (local_40._M_engaged == true) {
    iVar1 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->size_)._M_h,(key_type *)&local_40);
    unaff_R15 = (_Storage<unsigned_long,_true>)
                ((_Storage<unsigned_long,_true> *)
                ((long)iVar1.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                       ._M_cur + 0x28))->_M_value;
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_40);
  oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ =
       CONCAT71((int7)((ulong)&local_40 >> 8),local_40._M_engaged) & 0xffffffff;
  oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = unaff_R15._M_value;
  return (optional<unsigned_long>)
         oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> Size(const Type& u) {
    if (auto u_rep = Find(u))
      return size_.find(*u_rep)->second;
    return {};
  }